

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int StopThreadMTx(MT *pMT)

{
  int local_1c;
  int id;
  MT *pMT_local;
  
  local_1c = 0;
  do {
    if ((MT *)addrsMT[local_1c] == pMT) {
      bExitMT[local_1c] = 1;
      WaitForThread(MTThreadId[local_1c]);
      DeleteCriticalSection(MTCS + local_1c);
      resMT[local_1c] = 1;
      return 0;
    }
    local_1c = local_1c + 1;
  } while (local_1c < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int StopThreadMTx(MT* pMT)
{
	int id = 0;

	while (addrsMT[id] != pMT)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	bExitMT[id] = TRUE;
	WaitForThread(MTThreadId[id]);
	DeleteCriticalSection(&MTCS[id]);
	resMT[id] = EXIT_FAILURE;
	return EXIT_SUCCESS;
}